

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  Token *this_01;
  undefined8 uVar1;
  int iVar2;
  TransformNode *this_02;
  mapped_type *child_00;
  runtime_error *this_03;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *in_RDX;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  size_t child;
  AffineSpace3fa space;
  ulong uStack_f0;
  ulong uStack_e0;
  string local_d8;
  float local_b8;
  undefined1 local_a8 [16];
  key_type local_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  ulong uStack_60;
  undefined1 local_58 [16];
  float local_48;
  
  this_00 = (XML *)*in_RDX;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"child","");
  XML::parm((string *)&local_88.field_1,this_00,&local_d8);
  iVar2 = atoi((char *)local_88._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  this_01 = *(Token **)(*in_RDX + 0x98);
  local_90 = (long)iVar2;
  if (*(long *)(*in_RDX + 0xa0) - (long)this_01 == 0x360) {
    local_a8._0_4_ = Token::Float(this_01,true);
    local_a8._4_4_ = extraout_XMM0_Db;
    local_a8._8_4_ = extraout_XMM0_Dc;
    local_a8._12_4_ = extraout_XMM0_Dd;
    fVar5 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    fVar6 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x90),true);
    local_a8._4_4_ = fVar5;
    local_a8._8_4_ = fVar6;
    local_a8._12_4_ = 0;
    fVar5 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0xd8),true);
    fVar6 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x120),true);
    fVar7 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x168),true);
    fVar8 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x1b0),true);
    local_b8 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x1f8),true);
    fVar9 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x240),true);
    uVar1 = CONCAT44(local_b8,fVar8);
    local_b8 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x288),true);
    local_48 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x2d0),true);
    fVar8 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x318),true);
    local_88._0_8_ = local_a8._0_8_;
    local_88._8_8_ = local_a8._8_8_;
    uStack_e0 = (ulong)(uint)fVar7;
    local_78._8_8_ = uStack_e0;
    uStack_f0 = (ulong)(uint)fVar9;
    uStack_60 = uStack_f0;
    local_58._4_4_ = local_48;
    local_58._0_4_ = local_b8;
    local_58._8_4_ = fVar8;
    local_58._12_4_ = 0;
    local_78._M_allocated_capacity = CONCAT44(fVar6,fVar5);
    local_68 = uVar1;
    this_02 = (TransformNode *)alignedMalloc(0xa0,0x10);
    child_00 = std::
               map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::at((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     *)(xml + 0xc),&local_90);
    SceneGraph::TransformNode::TransformNode(this_02,(AffineSpace3fa *)&local_88.field_1,child_00);
    (this->path).filename._M_dataplus._M_p = (pointer)this_02;
    (**(code **)((long)(this_02->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_02);
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_d8,(ParseLocation *)(*in_RDX + 0x10));
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_88._0_8_ = *plVar3;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ == paVar4) {
    local_78._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_78._8_8_ = plVar3[3];
    local_88._0_8_ = &local_78;
  }
  else {
    local_78._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_88._8_8_ = plVar3[1];
  *plVar3 = (long)paVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_03,(string *)&local_88.field_1);
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFTransformNode(const Ref<XML>& xml) 
  {
    const size_t child = atoi(xml->parm("child").c_str()); 
    if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
    const AffineSpace3fa space(LinearSpace3fa(Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float()),
                                              Vec3fa(xml->body[3].Float(),xml->body[4].Float(),xml->body[5].Float()),
                                              Vec3fa(xml->body[6].Float(),xml->body[7].Float(),xml->body[8].Float())),
                               Vec3fa(xml->body[9].Float(),xml->body[10].Float(),xml->body[11].Float()));
    return new SceneGraph::TransformNode(space,id2node.at(child));
  }